

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::getIterationProperties
          (TessellationShaderInvarianceRule6Test *this,uint n_iteration,float *out_inner_tess_levels
          ,float *out_outer_tess_levels,bool *out_point_mode,
          _tessellation_primitive_mode *out_primitive_mode,
          _tessellation_shader_vertex_ordering *out_vertex_ordering,uint *out_result_buffer_size)

{
  uint uVar1;
  _test_iteration *p_Var2;
  _test_iteration *test_iteration;
  _tessellation_primitive_mode *out_primitive_mode_local;
  bool *out_point_mode_local;
  float *out_outer_tess_levels_local;
  float *out_inner_tess_levels_local;
  uint n_iteration_local;
  TessellationShaderInvarianceRule6Test *this_local;
  
  p_Var2 = getTestForIteration(this,n_iteration);
  *(undefined8 *)out_inner_tess_levels = *(undefined8 *)p_Var2->inner_tess_levels;
  *(undefined8 *)out_outer_tess_levels = *(undefined8 *)p_Var2->outer_tess_levels;
  *(undefined8 *)(out_outer_tess_levels + 2) = *(undefined8 *)(p_Var2->outer_tess_levels + 2);
  *out_point_mode = false;
  *out_primitive_mode = p_Var2->primitive_mode;
  *out_vertex_ordering = p_Var2->vertex_ordering;
  if (out_result_buffer_size != (uint *)0x0) {
    uVar1 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      ((this->super_TessellationShaderInvarianceBaseTest).m_utils_ptr,
                       *out_primitive_mode,out_inner_tess_levels,out_outer_tess_levels,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,(bool)(*out_point_mode & 1));
    *out_result_buffer_size = uVar1;
    p_Var2->n_vertices = *out_result_buffer_size;
    *out_result_buffer_size = *out_result_buffer_size * 0xc;
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule6Test::getIterationProperties(
	unsigned int n_iteration, float* out_inner_tess_levels, float* out_outer_tess_levels, bool* out_point_mode,
	_tessellation_primitive_mode* out_primitive_mode, _tessellation_shader_vertex_ordering* out_vertex_ordering,
	unsigned int* out_result_buffer_size)
{
	DE_ASSERT(m_test_triangles_iterations.size() + m_test_quads_iterations.size() > n_iteration);

	_test_iteration& test_iteration = getTestForIteration(n_iteration);

	memcpy(out_inner_tess_levels, test_iteration.inner_tess_levels, sizeof(test_iteration.inner_tess_levels));
	memcpy(out_outer_tess_levels, test_iteration.outer_tess_levels, sizeof(test_iteration.outer_tess_levels));

	*out_point_mode		 = false;
	*out_primitive_mode  = test_iteration.primitive_mode;
	*out_vertex_ordering = test_iteration.vertex_ordering;

	if (out_result_buffer_size != DE_NULL)
	{
		*out_result_buffer_size = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
			*out_primitive_mode, out_inner_tess_levels, out_outer_tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
			*out_point_mode);
		test_iteration.n_vertices = *out_result_buffer_size;
		*out_result_buffer_size =
			static_cast<unsigned int>(*out_result_buffer_size * 3 /* components */ * sizeof(float));

		DE_ASSERT(*out_result_buffer_size != 0);
	}
}